

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void libyuv::YuvPixel16(int16_t y,int16_t u,int16_t v,int *b,int *g,int *r,
                       YuvConstants *yuvconstants)

{
  char cVar1;
  char cVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  uint uVar6;
  undefined6 in_register_00000012;
  uint uVar8;
  undefined6 in_register_00000032;
  uint uVar9;
  undefined6 in_register_0000003a;
  ulong uVar7;
  
  cVar1 = yuvconstants->kUVToG[0];
  cVar2 = yuvconstants->kUVToG[1];
  cVar3 = yuvconstants->kUVToR[1];
  sVar4 = yuvconstants->kUVBiasG[0];
  sVar5 = yuvconstants->kUVBiasR[0];
  uVar7 = CONCAT62(in_register_00000032,u) >> 2 & 0x3fffffff;
  uVar8 = (uint)uVar7;
  if (0xfe < (short)uVar7) {
    uVar8 = 0xff;
  }
  uVar7 = CONCAT62(in_register_00000012,v) >> 2 & 0x3fffffff;
  uVar6 = (uint)uVar7;
  if (0xfe < (short)uVar7) {
    uVar6 = 0xff;
  }
  uVar9 = (uint)((int)yuvconstants->kYToRgb[0] * (int)CONCAT62(in_register_0000003a,y)) >> 10 &
          0xffff;
  *b = ((int)yuvconstants->kUVBiasB[0] - (int)yuvconstants->kUVToB[0] * (uVar8 & 0xff)) + uVar9;
  *g = ((int)sVar4 - ((int)cVar2 * (uVar6 & 0xff) + (uVar8 & 0xff) * (int)cVar1)) + uVar9;
  *r = ((int)sVar5 - (uVar6 & 0xff) * (int)cVar3) + uVar9;
  return;
}

Assistant:

static __inline void YuvPixel16(int16_t y,
                                int16_t u,
                                int16_t v,
                                int* b,
                                int* g,
                                int* r,
                                const struct YuvConstants* yuvconstants) {
#if defined(__aarch64__)
  int ub = -yuvconstants->kUVToRB[0];
  int ug = yuvconstants->kUVToG[0];
  int vg = yuvconstants->kUVToG[1];
  int vr = -yuvconstants->kUVToRB[1];
  int bb = yuvconstants->kUVBiasBGR[0];
  int bg = yuvconstants->kUVBiasBGR[1];
  int br = yuvconstants->kUVBiasBGR[2];
  int yg = yuvconstants->kYToRgb[1];
#elif defined(__arm__)
  int ub = -yuvconstants->kUVToRB[0];
  int ug = yuvconstants->kUVToG[0];
  int vg = yuvconstants->kUVToG[4];
  int vr = -yuvconstants->kUVToRB[4];
  int bb = yuvconstants->kUVBiasBGR[0];
  int bg = yuvconstants->kUVBiasBGR[1];
  int br = yuvconstants->kUVBiasBGR[2];
  int yg = yuvconstants->kYToRgb[1];
#else
  int ub = yuvconstants->kUVToB[0];
  int ug = yuvconstants->kUVToG[0];
  int vg = yuvconstants->kUVToG[1];
  int vr = yuvconstants->kUVToR[1];
  int bb = yuvconstants->kUVBiasB[0];
  int bg = yuvconstants->kUVBiasG[0];
  int br = yuvconstants->kUVBiasR[0];
  int yg = yuvconstants->kYToRgb[0];
#endif

  uint32_t y1 = (uint32_t)((y << 6) * yg) >> 16;
  u = clamp255(u >> 2);
  v = clamp255(v >> 2);
  *b = (int)(-(u * ub) + y1 + bb);
  *g = (int)(-(u * ug + v * vg) + y1 + bg);
  *r = (int)(-(v * vr) + y1 + br);
}